

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_coeffs_2tap_avx2(InterpFilterParams *filter_params,int32_t subpel_q4,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  int16_t *piVar2;
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  InterpFilterParams *in_RDI;
  __m256i coeff;
  __m128i coeff_8;
  int16_t *filter;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  piVar2 = av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  loadu_int32(piVar2 + 3);
  auVar1._8_8_ = uStack_28;
  auVar1._0_8_ = uStack_30;
  auVar1._16_8_ = uStack_30;
  auVar1._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar1,0);
  *in_RDX = auVar1;
  return;
}

Assistant:

static inline void prepare_coeffs_2tap_avx2(
    const InterpFilterParams *const filter_params, const int32_t subpel_q4,
    __m256i *const coeffs /* [1] */) {
  const int16_t *filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);

  const __m128i coeff_8 = _mm_cvtsi32_si128(loadu_int32(filter + 3));
  const __m256i coeff = _mm256_broadcastsi128_si256(coeff_8);

  // coeffs 3 4 3 4 3 4 3 4
  coeffs[0] = _mm256_shuffle_epi32(coeff, 0x00);
}